

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.H
# Opt level: O1

void __thiscall
pele::physics::Factory<pele::physics::reactions::ReactorBase>::
Register<pele::physics::reactions::ReactorCvode>::~Register
          (Register<pele::physics::reactions::ReactorCvode> *this)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  iterator iVar1;
  key_type local_30;
  
  (this->super_ReactorBase).super_Factory<pele::physics::reactions::ReactorBase>._vptr_Factory =
       (_func_int **)&PTR__Register_0074e6b8;
  if (registered == '\x01') {
    this_00 = &table_abi_cxx11_()->_M_h;
    local_30.field_2._M_allocated_capacity = 0x43726f7463616552;
    local_30.field_2._8_4_ = 0x65646f76;
    local_30._M_string_length = 0xc;
    local_30.field_2._M_local_buf[0xc] = '\0';
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_00,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    registered = iVar1.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                 ._M_cur != (__node_type *)0x0;
  }
  return;
}

Assistant:

~Register() override
    {
      if (registered) {
        auto& tbl = Factory::table();
        const auto& it = tbl.find(T::identifier());
        registered = (it != tbl.end());
      }
    }